

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O1

void __thiscall Helper::GeneratePermutedVectors(Helper *this,int n_p,int n_d,int count)

{
  vector<long,_std::allocator<long>_> *this_00;
  vector<long,std::allocator<long>> *this_01;
  iterator iVar1;
  char cVar2;
  pointer __n;
  char cVar3;
  uint size;
  ostream *poVar4;
  long *plVar5;
  int k;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  pointer pbVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string local_7d0 [8];
  ifstream fin2;
  string local_5c8 [8];
  ifstream fin1;
  long local_3c0;
  ofstream output_file;
  ios_base local_2c8 [264];
  undefined1 local_1c0 [8];
  vector<int,_std::allocator<int>_> Pi;
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  long *local_e0 [2];
  long local_d0 [2];
  undefined1 local_c0 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  temp;
  long temp1;
  long temp2;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  R;
  long local_70;
  uint local_68;
  int local_64;
  uint local_60;
  uint local_5c;
  undefined1 local_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_name;
  
  local_60 = n_d;
  local_5c = n_p;
  std::ofstream::ofstream(&local_3c0);
  std::ifstream::ifstream(local_5c8);
  std::ifstream::ifstream(local_7d0);
  local_1c0 = (undefined1  [8])
              &Pi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c0,"../randoms/bob/Pi_diff_R_PA_PB.txt","");
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a0,"../randoms/alice/Pi_diff_R_PB_PA.txt","");
  local_180[0] = local_170;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_180,"../randoms/bob/Pi_diff_R_DA_DB.txt","");
  local_160[0] = local_150;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_160,"../randoms/alice/Pi_diff_R_DB_DA.txt","");
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_140,"../randoms/alice/R_PA.txt","");
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"../randoms/bob/R_PB.txt","");
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_100,"../randoms/alice/R_DA.txt","");
  plVar5 = local_d0;
  local_e0[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"../randoms/bob/R_DB.txt","");
  __l._M_len = 8;
  __l._M_array = (iterator)local_1c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_58,__l,(allocator_type *)&temp2);
  lVar10 = -0x100;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -4;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0);
  uVar8 = 0;
  do {
    pbVar9 = (pointer)((long)local_58 + uVar8 * 0x20);
    std::ofstream::open((string *)&local_3c0,(_Ios_Openmode)pbVar9);
    size = local_60;
    if (uVar8 < 2) {
      size = local_5c;
    }
    iVar12 = local_58._0_4_;
    switch(uVar8 & 0xffffffff) {
    case 0:
      std::ifstream::open(local_5c8,iVar12 + 0x80);
      lVar10 = 0xa0;
      break;
    case 1:
      std::ifstream::open(local_5c8,iVar12 + 0xa0);
      pbVar9 = (pointer)((long)local_58 + 0x80);
      goto LAB_00103808;
    case 2:
      std::ifstream::open(local_5c8,iVar12 + 0xc0);
      lVar10 = 0xe0;
      break;
    case 3:
      std::ifstream::open(local_5c8,iVar12 + 0xe0);
      lVar10 = 0xc0;
      break;
    default:
      goto switchD_0010376a_default;
    }
    pbVar9 = (pointer)((long)&((_Alloc_hider *)local_58)->_M_p + lVar10);
LAB_00103808:
    std::ifstream::open(local_7d0,(_Ios_Openmode)pbVar9);
switchD_0010376a_default:
    if (count != 0) {
      local_68 = (uint)(uVar8 < 2) * 3 + 2;
      R.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(long)(int)size;
      file_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)size;
      uVar11 = (ulong)local_68;
      iVar12 = count;
      do {
        local_64 = iVar12;
        LoadNextRandomPermutation
                  ((vector<int,_std::allocator<int>_> *)local_1c0,(Helper *)pbVar9,(int)uVar8,size);
        __n = R.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)&temp2,
                 (size_type)
                 R.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(allocator_type *)local_c0);
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)local_c0,(size_type)__n,(allocator_type *)&local_70);
        if (0 < (int)size) {
          pbVar9 = (pointer)0x0;
          uVar6 = local_68;
          do {
            std::istream::_M_extract<long>((long *)local_5c8);
            std::istream::_M_extract<long>((long *)local_7d0);
            this_00 = (vector<long,_std::allocator<long>_> *)((long)local_c0 + pbVar9 * 0x18);
            local_70 = (long)temp.
                             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage - temp1;
            iVar1._M_current =
                 (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar1._M_current ==
                (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                        (this_00,iVar1,&local_70);
            }
            else {
              *iVar1._M_current = local_70;
              (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar1._M_current + 1;
            }
            uVar6 = uVar6 - 1;
          } while ((uVar6 != 0) ||
                  (pbVar9 = (pointer)((long)&(pbVar9->_M_dataplus)._M_p + 1), uVar6 = local_68,
                  pbVar9 != file_name.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage));
        }
        if (0 < (int)size) {
          pbVar9 = (pointer)0x0;
          do {
            lVar10 = 0;
            uVar7 = uVar11;
            do {
              this_01 = (vector<long,std::allocator<long>> *)
                        (temp2 + (long)*(int *)((long)local_1c0 + (long)pbVar9 * 4) * 0x18);
              plVar5 = (long *)((long)(((pointer)((long)local_c0 + pbVar9 * 0x18))->
                                      super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                      super__Vector_impl_data._M_start + lVar10);
              iVar1._M_current = *(long **)(this_01 + 8);
              if (iVar1._M_current == *(long **)(this_01 + 0x10)) {
                std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                          (this_01,iVar1,plVar5);
              }
              else {
                *iVar1._M_current = *plVar5;
                *(long **)(this_01 + 8) = iVar1._M_current + 1;
              }
              lVar10 = lVar10 + 8;
              uVar7 = uVar7 - 1;
            } while (uVar7 != 0);
            pbVar9 = (pointer)((long)&(pbVar9->_M_dataplus)._M_p + 1);
          } while (pbVar9 != file_name.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        cVar2 = (char)&local_3c0;
        if (0 < (int)size) {
          pbVar9 = (pointer)0x0;
          do {
            uVar7 = 0;
            do {
              poVar4 = std::ostream::_M_insert<long>((long)&local_3c0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
              uVar7 = uVar7 + 1;
            } while (uVar11 != uVar7);
            std::ios::widen((char)*(undefined8 *)(local_3c0 + -0x18) + cVar2);
            std::ostream::put(cVar2);
            std::ostream::flush();
            pbVar9 = (pointer)((long)&(pbVar9->_M_dataplus)._M_p + 1);
          } while (pbVar9 != file_name.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        cVar3 = std::ios::widen((char)*(undefined8 *)(local_3c0 + -0x18) + cVar2);
        pbVar9 = (pointer)(ulong)(uint)(int)cVar3;
        std::ostream::put(cVar2);
        std::ostream::flush();
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   *)local_c0);
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   *)&temp2);
        iVar12 = local_64;
        if (local_1c0 != (undefined1  [8])0x0) {
          pbVar9 = (pointer)((long)Pi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)local_1c0);
          operator_delete((void *)local_1c0,(ulong)pbVar9);
        }
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    std::ifstream::close();
    std::ifstream::close();
    std::ostream::flush();
    std::ofstream::close();
    uVar8 = uVar8 + 1;
    if (uVar8 == 4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_58);
      std::ifstream::~ifstream(local_7d0);
      std::ifstream::~ifstream(local_5c8);
      local_3c0 = _VTT;
      *(undefined8 *)((long)&local_3c0 + *(long *)(_VTT + -0x18)) = __filebuf;
      std::filebuf::~filebuf((filebuf *)&output_file);
      std::ios_base::~ios_base(local_2c8);
      return;
    }
  } while( true );
}

Assistant:

void Helper::GeneratePermutedVectors(int n_p, int n_d, int count)
{
    std::ofstream output_file;
    std::ifstream fin1, fin2;
    std::vector<std::string> file_name = {"../randoms/bob/Pi_diff_R_PA_PB.txt", "../randoms/alice/Pi_diff_R_PB_PA.txt",
                                          "../randoms/bob/Pi_diff_R_DA_DB.txt", "../randoms/alice/Pi_diff_R_DB_DA.txt",
                                          "../randoms/alice/R_PA.txt", "../randoms/bob/R_PB.txt", "../randoms/alice/R_DA.txt", "../randoms/bob/R_DB.txt"};
    for (int i = 0; i < 4; i++)
    {
        output_file.open(file_name[i]);
        int n = (i < 2 ? n_p : n_d);
        int m = (i < 2 ? 5 : 2);
        switch (i)
        {
        case 0:
            fin1.open(file_name[4]);
            fin2.open(file_name[5]);
            break;
        case 1:
            fin1.open(file_name[5]);
            fin2.open(file_name[4]);
            break;
        case 2:
            fin1.open(file_name[6]);
            fin2.open(file_name[7]);
            break;
        case 3:
            fin1.open(file_name[7]);
            fin2.open(file_name[6]);
            break;
        default:
            break;
        }

        int l = count;
        long temp1, temp2;
        while (l--)
        {
            std::vector<int> Pi = LoadNextRandomPermutation(i, n);
            std::vector<std::vector<long>> R(n),temp(n);
            for (int j = 0; j < n; j++)
            {
                for (int k = 0; k < m; k++)
                {
                    fin1 >> temp1;
                    fin2 >> temp2;
                    temp[j].push_back(temp1-temp2);
                }
            }
            for (int j = 0; j < n; j++)
            {
                for (int k = 0; k < m; k++)
                    R[Pi[j]].push_back(temp[j][k]);
                    
            }
            for (int j = 0; j < n; j++)
            {
                for (int k = 0; k < m; k++)
                {
                   output_file<<R[j][k]<<" "; 
                }
                output_file<<std::endl;
            }
            output_file<<std::endl;
        }
        fin1.close();
        fin2.close();
        output_file.flush();
        output_file.close();
    }
}